

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O0

PyObject * libxml_xmlTextReaderPtrWrap(xmlTextReaderPtr reader)

{
  PyObject *ret;
  xmlTextReaderPtr reader_local;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    _Py_INCREF((PyObject *)&_Py_NoneStruct);
    reader_local = (xmlTextReaderPtr)&_Py_NoneStruct;
  }
  else {
    reader_local = (xmlTextReaderPtr)PyCapsule_New(reader,"xmlTextReaderPtr",0);
  }
  return (PyObject *)reader_local;
}

Assistant:

PyObject *
libxml_xmlTextReaderPtrWrap(xmlTextReaderPtr reader)
{
    PyObject *ret;

    if (reader == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    ret =
        PyCapsule_New((void *) reader,
                                     (char *) "xmlTextReaderPtr", NULL);
    return (ret);
}